

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall Hospital::Last_Name_Validate(Hospital *this,string *Last_Name)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  string *psVar5;
  ulong uVar6;
  string Last_Name_1;
  byte *local_40;
  ulong local_38;
  long local_30 [2];
  
  pcVar2 = (Last_Name->_M_dataplus)._M_p;
  local_40 = (byte *)local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + Last_Name->_M_string_length);
  bVar3 = true;
  if (local_38 != 0) {
    bVar1 = *local_40;
    if (((char)bVar1 < 'A') || (0x19 < (byte)(bVar1 + 0x9f) && 0x5a < bVar1)) {
      bVar3 = false;
    }
    else {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (local_38 == uVar6) goto LAB_0011bf19;
        bVar1 = local_40[uVar6];
      } while (('@' < (char)bVar1) &&
              (uVar4 = uVar6 + 1, (byte)(bVar1 + 0x9f) < 0x1a || bVar1 < 0x5b));
      bVar3 = local_38 <= uVar6;
    }
  }
LAB_0011bf19:
  if (local_40 != (byte *)local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Your Last_Name must consist of numbers character !",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return false;
  }
  psVar5 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar5 = psVar5 + 0x10;
  pcVar2 = (Last_Name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>(psVar5,pcVar2,pcVar2 + Last_Name->_M_string_length);
  __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool Hospital :: Last_Name_Validate(string Last_Name){
    try {
        if(!validate_String_Must_Be_character(Last_Name)) {
            cout <<"Your Last_Name must consist of numbers character !"<<endl;
            return false;
        }
        else throw Last_Name;
    }
    catch(string Last_Name) {
        cout << "your Last_Name entered successfully ."<<endl;
        return true;
    }
}